

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O3

void print_symbol(TextBuffer *buf,LuaSymbol *sym,int level)

{
  Scope *pSVar1;
  StringObject *pSVar2;
  char *pcVar3;
  LuaSymbolList *pLVar4;
  StringObject *pSVar5;
  char *format;
  char *pcVar6;
  
  switch(sym->symbol_type) {
  case SYM_LOCAL:
    pSVar5 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pSVar1 = (sym->field_1).label.block;
    pLVar4 = (LuaSymbolList *)0x136a23;
    if (pSVar1 != (Scope *)0x0) {
      pLVar4 = pSVar1->symbol_list;
    }
    format = "%p%t %c %s %s %s\n";
    pcVar6 = "local symbol";
    break;
  case SYM_UPVALUE:
    pSVar2 = (sym->field_1).variable.var_name;
    pSVar5 = *(StringObject **)(pSVar2 + 1);
    pcVar3 = raviX_get_type_name(pSVar2->hash);
    if (pSVar2->str == (char *)0x0) {
      pLVar4 = (LuaSymbolList *)0x136a23;
    }
    else {
      pLVar4 = *(LuaSymbolList **)(pSVar2->str + 0x10);
    }
    format = "%p%t %c %s %s\n";
    pcVar6 = "upvalue";
    break;
  case SYM_GLOBAL:
    pSVar5 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pSVar1 = (sym->field_1).label.block;
    if (pSVar1 == (Scope *)0x0) {
      pLVar4 = (LuaSymbolList *)0x136a23;
    }
    else {
      pLVar4 = pSVar1->symbol_list;
    }
    format = "%p%t %c %s %s\n";
    pcVar6 = "global symbol";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_printer.c"
                  ,0xaa,"void print_symbol(TextBuffer *, LuaSymbol *, int)");
  case SYM_ENV:
    pSVar5 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pSVar1 = (sym->field_1).label.block;
    if (pSVar1 == (Scope *)0x0) {
      pLVar4 = (LuaSymbolList *)0x136a23;
    }
    else {
      pLVar4 = pSVar1->symbol_list;
    }
    format = "%p%t %c %s %s\n";
    pcVar6 = "_ENV";
  }
  printf_buf(buf,format,(ulong)(uint)level,pSVar5,pcVar6,pcVar3,pLVar4);
  return;
}

Assistant:

static void print_symbol(TextBuffer *buf, LuaSymbol *sym, int level)
{
	switch (sym->symbol_type) {
	case SYM_ENV: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->variable.var_name, "_ENV",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name));
		break;
	}
	case SYM_GLOBAL: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->variable.var_name, "global symbol",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name));
		break;
	}
	case SYM_LOCAL: {
		printf_buf(buf, "%p%t %c %s %s %s\n", level, sym->variable.var_name, "local symbol",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name),
			   (sym->variable.modified ? "" : " const"));
		break;
	}
	case SYM_UPVALUE: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->upvalue.target_variable->variable.var_name, "upvalue",
			   raviX_get_type_name(sym->upvalue.target_variable->variable.value_type.type_code),
			   get_as_str(sym->upvalue.target_variable->variable.value_type.type_name));
		break;
	}
	default:
		assert(0);
	}
}